

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertUndefinedFunction
          (GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  bool bVar1;
  NodeSequence NVar2;
  string funcName;
  string sStack_48;
  StringRef local_28;
  
  local_28 = (StringRef)llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(&sStack_48,&local_28);
  bVar1 = std::operator==(&sStack_48,"pthread_create");
  if (bVar1) {
    NVar2 = insertPthreadCreate(this,callInstruction);
  }
  else {
    bVar1 = std::operator==(&sStack_48,"pthread_join");
    if (bVar1) {
      NVar2 = insertPthreadJoin(this,callInstruction);
    }
    else {
      bVar1 = std::operator==(&sStack_48,"pthread_exit");
      if (bVar1) {
        NVar2 = insertPthreadExit(this,callInstruction);
      }
      else {
        bVar1 = std::operator==(&sStack_48,"pthread_mutex_lock");
        if (bVar1) {
          NVar2 = insertPthreadMutexLock(this,callInstruction);
        }
        else {
          bVar1 = std::operator==(&sStack_48,"pthread_mutex_unlock");
          if (bVar1) {
            NVar2 = insertPthreadMutexUnlock(this,callInstruction);
          }
          else {
            NVar2 = buildGeneralCallInstruction(this,callInstruction);
          }
        }
      }
    }
  }
  std::__cxx11::string::_M_dispose();
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertUndefinedFunction(const Function *function,
                                      const CallInst *callInstruction) {
    std::string funcName = function->getName().str();

    if (funcName == "pthread_create") {
        return insertPthreadCreate(callInstruction);
    }
    if (funcName == "pthread_join") {
        return insertPthreadJoin(callInstruction);
    }
    if (funcName == "pthread_exit") {
        return insertPthreadExit(callInstruction);
    }
    if (funcName == "pthread_mutex_lock") {
        return insertPthreadMutexLock(callInstruction);
    } else if (funcName == "pthread_mutex_unlock") {
        return insertPthreadMutexUnlock(callInstruction);
    } else {
        return buildGeneralCallInstruction(callInstruction);
    }
}